

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O3

int64_t primecount::pi_lmo4(int64_t x)

{
  int iVar1;
  double dVar2;
  undefined1 x_00 [16];
  bool *pbVar3;
  bool *pbVar4;
  bool bVar5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long res;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int64_t m;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  type primes;
  BinaryIndexedTree tree;
  Vector<bool,_std::allocator<bool>_> sieve;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  undefined8 in_stack_fffffffffffffe88;
  double dVar21;
  int *in_stack_fffffffffffffe90;
  int *local_168;
  int *local_160;
  long local_140;
  Vector<int,_std::allocator<int>_> local_138;
  ulong uStack_120;
  Vector<long,_std::allocator<long>_> local_118;
  Vector<bool,_std::allocator<bool>_> local_f8;
  size_t local_e0;
  long local_d8;
  long *local_d0;
  Vector<long,_std::allocator<long>_> local_c8;
  ulong local_a8;
  int64_t local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  long *local_80;
  ulong local_78;
  ulong local_70;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<int,_std::allocator<int>_> local_48;
  
  if (x < 2) {
    iVar7 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe90;
    x_00._0_8_ = in_stack_fffffffffffffe88;
    dVar21 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar2 = cbrt((double)x);
    uVar11 = (ulong)dVar2;
    if (0 < (long)uVar11) {
      do {
        if (uVar11 * uVar11 - (ulong)x / uVar11 == 0 ||
            (long)(uVar11 * uVar11) < (long)((ulong)x / uVar11)) goto LAB_0011a6d7;
        bVar5 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar5);
      uVar11 = 0;
    }
LAB_0011a6d7:
    lVar12 = uVar11 - 1;
    do {
      lVar13 = lVar12 + 2;
      lVar12 = lVar12 + 1;
    } while (lVar13 * lVar13 - x / lVar13 == 0 || lVar13 * lVar13 < x / lVar13);
    uVar20 = (ulong)(dVar21 * (double)lVar12);
    uVar11 = 8;
    if (uVar20 < 0x14) {
      uVar11 = (ulong)(byte)(&PhiTiny::pi)[uVar20];
    }
    generate_primes_i32((Vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe90,uVar20);
    generate_lpf(&local_48,uVar20);
    generate_moebius(&local_60,uVar20);
    lVar12 = (long)local_168 - (long)in_stack_fffffffffffffe90;
    bVar5 = is_print();
    lVar12 = (lVar12 >> 2) + -1;
    uVar6 = P2(x,uVar20,lVar12,1,bVar5);
    bVar5 = is_print();
    iVar7 = S1(x,uVar20,uVar11,1,bVar5);
    uVar8 = x / (long)uVar20;
    dVar21 = (double)(long)uVar8;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    uVar15 = 0xb504f333;
    if ((long)dVar21 < 0xb504f333) {
      uVar15 = (long)dVar21;
    }
    if ((long)uVar8 < (long)(uVar15 * uVar15)) {
      do {
        uVar15 = uVar15 - 1;
      } while (uVar15 * uVar15 - uVar8 != 0 && (long)uVar8 <= (long)(uVar15 * uVar15));
    }
    else {
      lVar13 = uVar15 * 2;
      if (lVar13 < (long)(uVar8 - uVar15 * uVar15)) {
        do {
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)(uVar8 - uVar15 * uVar15));
      }
    }
    lVar13 = 0x3f;
    if (uVar15 - 1 != 0) {
      for (; uVar15 - 1 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    local_e0 = 1L << (-((byte)lVar13 ^ 0x3f) & 0x3f);
    if (uVar15 < 2) {
      local_e0 = 1;
    }
    local_138.capacity_ = (int *)0x0;
    uStack_120 = 0;
    local_138.array_ = (int *)0x0;
    local_138.end_ = (int *)0x0;
    local_f8.array_ = (bool *)0x0;
    local_f8.end_ = (bool *)0x0;
    local_f8.capacity_ = (bool *)0x0;
    Vector<bool,_std::allocator<bool>_>::resize(&local_f8,local_e0);
    local_c8.array_ = (long *)0x0;
    local_c8.end_ = (long *)0x0;
    local_c8.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_c8,(long)local_168 - (long)in_stack_fffffffffffffe90 >> 2);
    local_118.array_ = (long *)0x0;
    local_118.end_ = (long *)0x0;
    local_118.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_118,(long)local_168 - (long)in_stack_fffffffffffffe90 >> 2);
    lVar13 = (long)local_168 - (long)in_stack_fffffffffffffe90 >> 2;
    if (0 < lVar13) {
      uVar15 = lVar13 + 1;
      lVar13 = 0;
      do {
        *(long *)((long)local_c8.array_ + lVar13 * 2) =
             (long)*(int *)((long)in_stack_fffffffffffffe90 + lVar13);
        uVar15 = uVar15 - 1;
        lVar13 = lVar13 + 4;
      } while (1 < uVar15);
    }
    if (local_118.array_ != local_118.end_) {
      memset(local_118.array_,0,(long)local_118.end_ - (long)local_118.array_ & 0xfffffffffffffff8);
    }
    local_a8 = uVar6;
    local_a0 = iVar7;
    if ((long)uVar8 < 2) {
      local_140 = 0;
    }
    else {
      local_98 = uVar11 + 1;
      local_d8 = -1;
      local_140 = 0;
      uVar6 = 1;
      local_88 = uVar20;
      do {
        pbVar4 = local_f8.end_;
        pbVar3 = local_f8.array_;
        local_90 = local_e0 + uVar6;
        uVar20 = local_90;
        if ((long)uVar8 < (long)local_90) {
          uVar20 = uVar8;
        }
        if (local_f8.array_ != local_f8.end_) {
          memset(local_f8.array_,1,(long)local_f8.end_ - (long)local_f8.array_);
        }
        if (uVar11 != 0) {
          uVar15 = 1;
          do {
            lVar13 = local_c8.array_[uVar15];
            if (lVar13 < (long)uVar20) {
              iVar1 = in_stack_fffffffffffffe90[uVar15];
              do {
                pbVar3[lVar13 + local_d8] = false;
                lVar13 = lVar13 + iVar1;
              } while (lVar13 < (long)uVar20);
            }
            local_c8.array_[uVar15] = lVar13;
            bVar5 = uVar15 != uVar11;
            uVar15 = uVar15 + 1;
          } while (bVar5);
        }
        uStack_120 = (ulong)((long)pbVar4 - (long)pbVar3) >> 1;
        Vector<int,_std::allocator<int>_>::resize(&local_138,uStack_120);
        if (0 < (long)uStack_120) {
          uVar15 = 0;
          do {
            uVar16 = (uint)local_f8.array_[uVar15 * 2];
            local_138.array_[uVar15] = (uint)local_f8.array_[uVar15 * 2];
            uVar14 = uVar15 + 1;
            uVar17 = ~uVar15 & uVar14;
            uVar19 = uVar15;
            if (1 < uVar17) {
              do {
                uVar16 = uVar16 + local_138.array_[uVar19 - 1];
                local_138.array_[uVar15] = uVar16;
                bVar5 = 3 < uVar17;
                uVar19 = uVar19 & uVar19 - 1;
                uVar17 = uVar17 >> 1;
              } while (bVar5);
            }
            uVar15 = uVar14;
          } while (uVar14 != uStack_120);
        }
        if (local_98 < lVar12) {
          local_70 = (long)(~uVar6 + uVar20) >> 1;
          local_78 = local_70 + 1 & local_70;
          local_80 = local_118.array_;
          local_d0 = local_c8.array_;
          lVar13 = local_98;
          do {
            lVar18 = (long)in_stack_fffffffffffffe90[lVar13];
            lVar9 = x / (long)(uVar20 * lVar18);
            lVar10 = (long)local_88 / lVar18;
            if ((long)local_88 / lVar18 < lVar9) {
              lVar10 = lVar9;
            }
            uVar15 = x / (long)(uVar6 * lVar18);
            if ((long)local_88 <= (long)uVar15) {
              uVar15 = local_88;
            }
            if ((long)uVar15 <= lVar18) break;
            for (; lVar10 < (long)uVar15; uVar15 = uVar15 - 1) {
              if (((long)local_60.array_[uVar15] != 0) &&
                 (in_stack_fffffffffffffe90[lVar13] < local_48.array_[uVar15])) {
                uVar17 = (long)(x / (long)(uVar15 * lVar18) - uVar6) >> 1;
                uVar19 = uVar17 + 1;
                lVar9 = (long)local_138.array_[uVar17];
                while (uVar19 = uVar19 & uVar17, uVar19 != 0) {
                  lVar9 = lVar9 + local_138.array_[uVar19 - 1];
                  uVar17 = uVar19 - 1;
                }
                local_140 = local_140 -
                            (lVar9 + local_118.array_[lVar13]) * (long)local_60.array_[uVar15];
              }
            }
            lVar10 = (long)local_138.array_[local_70];
            for (uVar15 = local_78; uVar15 != 0; uVar15 = uVar15 & uVar15 - 1) {
              lVar10 = lVar10 + local_138.array_[uVar15 - 1];
            }
            local_118.array_[lVar13] = local_118.array_[lVar13] + lVar10;
            lVar10 = local_c8.array_[lVar13];
            if (lVar10 < (long)uVar20) {
              do {
                lVar9 = lVar10 - uVar6;
                if (local_f8.array_[lVar9] == true) {
                  local_f8.array_[lVar9] = false;
                  uVar15 = lVar9 >> 1;
                  do {
                    local_138.array_[uVar15] = local_138.array_[uVar15] + -1;
                    uVar15 = uVar15 | uVar15 + 1;
                  } while ((long)uVar15 < (long)uStack_120);
                }
                lVar10 = lVar10 + lVar18 * 2;
              } while (lVar10 < (long)uVar20);
            }
            local_c8.array_[lVar13] = lVar10;
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar12);
        }
        local_d8 = local_d8 - local_e0;
        uVar6 = local_90;
      } while ((long)local_90 < (long)uVar8);
    }
    operator_delete(local_118.array_,(long)local_118.capacity_ - (long)local_118.array_);
    operator_delete(local_c8.array_,(long)local_c8.capacity_ - (long)local_c8.array_);
    operator_delete(local_f8.array_,(long)local_f8.capacity_ - (long)local_f8.array_);
    operator_delete(local_138.array_,(long)local_138.capacity_ - (long)local_138.array_);
    iVar7 = local_a0 + local_140 + lVar12 + ~local_a8;
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_48.array_,(long)local_48.capacity_ - (long)local_48.array_);
    operator_delete(in_stack_fffffffffffffe90,(long)local_160 - (long)in_stack_fffffffffffffe90);
  }
  return iVar7;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}